

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O3

void __thiscall
ear::PointSourcePannerDownmix::PointSourcePannerDownmix
          (PointSourcePannerDownmix *this,shared_ptr<ear::PointSourcePanner> *psp,MatrixXd *downmix)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_PointSourcePanner)._vptr_PointSourcePanner = (_func_int **)&PTR_handle_0020fac8;
  (this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (psp->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (psp->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  (this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->_downmix,
             (DenseStorage<double,__1,__1,__1,_0> *)downmix);
  return;
}

Assistant:

PointSourcePannerDownmix::PointSourcePannerDownmix(
      std::shared_ptr<PointSourcePanner> psp, Eigen::MatrixXd downmix)
      : _psp(psp), _downmix(downmix){}